

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

uint __thiscall Gluco::Solver::computeLBD(Solver *this,Clause *c)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Lit LVar4;
  uint *puVar5;
  int local_34;
  int l_1;
  int i_1;
  int l;
  uint local_20;
  int i;
  int nbDone;
  int nblevels;
  Clause *c_local;
  Solver *this_local;
  
  i = 0;
  this->MYFLAG = this->MYFLAG + 1;
  if (this->incremental == 0) {
    for (local_34 = 0; iVar2 = Clause::size(c), local_34 < iVar2; local_34 = local_34 + 1) {
      LVar4 = Clause::operator[](c,local_34);
      iVar2 = Gluco::var(LVar4);
      iVar2 = level(this,iVar2);
      puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
      if (*puVar5 != this->MYFLAG) {
        uVar3 = this->MYFLAG;
        puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
        *puVar5 = uVar3;
        i = i + 1;
      }
    }
  }
  else {
    local_20 = 0;
    l = 0;
    while ((iVar2 = Clause::size(c), l < iVar2 &&
           (uVar3 = Clause::sizeWithoutSelectors(c), local_20 < uVar3))) {
      LVar4 = Clause::operator[](c,l);
      iVar2 = Gluco::var(LVar4);
      bVar1 = isSelector(this,iVar2);
      if (!bVar1) {
        local_20 = local_20 + 1;
        LVar4 = Clause::operator[](c,l);
        iVar2 = Gluco::var(LVar4);
        iVar2 = level(this,iVar2);
        puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
        if (*puVar5 != this->MYFLAG) {
          uVar3 = this->MYFLAG;
          puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
          *puVar5 = uVar3;
          i = i + 1;
        }
      }
      l = l + 1;
    }
  }
  return i;
}

Assistant:

inline unsigned int Solver::computeLBD(const Clause &c) {
  int nblevels = 0;
  MYFLAG++;

  if(incremental) { // ----------------- INCREMENTAL MODE
     int nbDone = 0;
    for(int i=0;i<c.size();i++) {
      if(nbDone>=c.sizeWithoutSelectors()) break;
      if(isSelector(var(c[i]))) continue;
      nbDone++;
      int l = level(var(c[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  } else { // -------- DEFAULT MODE. NOT A LOT OF DIFFERENCES... BUT EASIER TO READ
    for(int i=0;i<c.size();i++) {
      int l = level(var(c[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  }
  return nblevels;
}